

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

StringRef llvm::sys::detail::getHostCPUNameForARM(StringRef ProcCpuinfoContent)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  unsigned_long_long *Result;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  StringRef SVar18;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Str;
  StringRef Chars_02;
  StringRef Str_00;
  StringRef Chars_03;
  StringRef Chars_04;
  StringRef Separator;
  StringRef I;
  unsigned_long_long ULLVal;
  SmallVector<llvm::StringRef,_32U> Lines;
  StringRef local_278;
  ulong local_260;
  ulong local_258;
  StringRef local_250;
  SmallVectorImpl<llvm::StringRef> local_240;
  undefined1 local_230 [512];
  
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_230;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Result = (unsigned_long_long *)0xffffffff;
  Separator.Length = 1;
  Separator.Data = "\n";
  StringRef::split(&local_250,&local_240,Separator,-1,true);
  uVar4 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  if (uVar4 == 0) {
    uVar4 = 0;
    lVar14 = 0;
    bVar15 = false;
    piVar5 = (int *)0x0;
  }
  else {
    lVar12 = 8;
    uVar10 = 0;
    piVar5 = (int *)0x0;
    lVar7 = 0;
    lVar14 = 0;
    local_258 = 0;
    do {
      if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) <= uVar10) {
LAB_00187ea4:
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      if ((0xe < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar12)) &&
         (*(long *)((long)*(long **)((long)local_240.
                                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                           super_SmallVectorBase.BeginX + lVar12 + -8) + 7) ==
          0x7265746e656d656c &&
          **(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar12 + -8) == 0x6c706d6920555043)) {
        local_278.Length =
             *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar12);
        uVar3 = 0xf;
        if (local_278.Length < 0xf) {
          uVar3 = local_278.Length;
        }
        local_278.Length = local_278.Length - uVar3;
        local_278.Data =
             (char *)(uVar3 + *(long *)((long)local_240.
                                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                              .super_SmallVectorBase.BeginX + lVar12 + -8));
        Chars.Length = 3;
        Chars.Data = "\t :";
        sVar2 = StringRef::find_first_not_of(&local_278,Chars,0);
        if (local_278.Length <= sVar2) {
          sVar2 = local_278.Length;
        }
        lVar7 = local_278.Length - sVar2;
        piVar5 = (int *)(sVar2 + (long)local_278.Data);
      }
      if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) <= uVar10) goto LAB_00187ea4;
      if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar12)) &&
         (**(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar12 + -8) == 0x6572617764726148)) {
        local_278.Length =
             *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar12);
        uVar3 = 8;
        if (local_278.Length < 8) {
          uVar3 = local_278.Length;
        }
        local_278.Length = local_278.Length - uVar3;
        local_278.Data =
             (char *)(uVar3 + *(long *)((long)local_240.
                                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                              .super_SmallVectorBase.BeginX + lVar12 + -8));
        Chars_00.Length = 3;
        Chars_00.Data = "\t :";
        sVar2 = StringRef::find_first_not_of(&local_278,Chars_00,0);
        if (local_278.Length <= sVar2) {
          sVar2 = local_278.Length;
        }
        local_258 = local_278.Length - sVar2;
        lVar14 = sVar2 + (long)local_278.Data;
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar4 != uVar10);
    bVar15 = lVar7 == 4;
    uVar4 = local_258;
  }
  pvVar1 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  sVar11 = 7;
  pcVar13 = "generic";
  if (bVar15) {
    if (*piVar5 == 0x31347830) {
      if (((6 < uVar4) &&
          (*(int *)(lVar14 + -4 + uVar4) == 0x34393938 &&
           *(int *)(lVar14 + -7 + uVar4) == 0x384d534d)) ||
         ((6 < uVar4 &&
          (*(int *)(lVar14 + -4 + uVar4) == 0x36393938 &&
           *(int *)(lVar14 + -7 + uVar4) == 0x384d534d)))) {
        sVar11 = 10;
        pcVar13 = "cortex-a53";
        goto LAB_00187e7d;
      }
      if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) != 0) {
        lVar14 = 0;
        do {
          if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + lVar14 + 8)) &&
             (**(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar14) == 0x7472617020555043)) {
            local_278.Length =
                 *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar14 + 8);
            uVar4 = 8;
            if (local_278.Length < 8) {
              uVar4 = local_278.Length;
            }
            local_278.Length = local_278.Length - uVar4;
            local_278.Data =
                 (char *)(uVar4 + *(long *)((long)local_240.
                                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                  .
                                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                  .super_SmallVectorBase.BeginX + lVar14));
            bVar15 = false;
            Chars_04.Length = 3;
            Chars_04.Data = "\t :";
            sVar2 = StringRef::find_first_not_of(&local_278,Chars_04,0);
            if (local_278.Length <= sVar2) {
              sVar2 = local_278.Length;
            }
            lVar14 = local_278.Length - sVar2;
            if (lVar14 == 5) {
              bVar15 = *(char *)((long)local_278.Data + sVar2 + 4) == '6' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x32397830;
            }
            if (bVar15) {
              pcVar8 = "arm926ej-s";
            }
            else {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '2' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30627830;
              }
              else {
                bVar16 = false;
              }
              pcVar8 = "arm926ej-s";
              if (bVar16) {
                pcVar8 = "mpcore";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '6' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x33627830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "arm1136j-s";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '6' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x35627830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "arm1156t2-s";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '6' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x37627830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "arm1176jz-s";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '8' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-a8";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '9' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-a9";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == 'f' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-a15";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '0' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x32637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-m0";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '3' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x32637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-m3";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '4' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x32637830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-m4";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            bVar16 = bVar15;
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar17 = *(char *)((long)local_278.Data + sVar2 + 4) == '4' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30647830;
              }
              else {
                bVar17 = false;
              }
              if (bVar17) {
                pcVar8 = "cortex-a35";
              }
              bVar16 = true;
              if (!bVar17) {
                bVar16 = bVar15;
              }
            }
            if (!bVar16) {
              if (lVar14 == 5) {
                bVar15 = *(char *)((long)local_278.Data + sVar2 + 4) == '3' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30647830;
              }
              else {
                bVar15 = false;
              }
              if (bVar15) {
                pcVar8 = "cortex-a53";
              }
              bVar16 = true;
              if (!bVar15) {
                bVar16 = false;
              }
            }
            bVar15 = bVar16;
            if (!bVar16) {
              if (lVar14 == 5) {
                bVar17 = *(char *)((long)local_278.Data + sVar2 + 4) == '7' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30647830;
              }
              else {
                bVar17 = false;
              }
              if (bVar17) {
                pcVar8 = "cortex-a57";
              }
              bVar15 = true;
              if (!bVar17) {
                bVar15 = bVar16;
              }
            }
            if (!bVar15) {
              if (lVar14 == 5) {
                bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '8' &&
                         *(int *)((long)local_278.Data + sVar2) == 0x30647830;
              }
              else {
                bVar16 = false;
              }
              if (bVar16) {
                pcVar8 = "cortex-a72";
              }
              bVar15 = true;
              if (!bVar16) {
                bVar15 = false;
              }
            }
            bVar16 = bVar15;
            if (bVar15) goto LAB_00187e5a;
            if (lVar14 == 5) {
              bVar17 = *(char *)((long)local_278.Data + sVar2 + 4) == '9' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30647830;
            }
            else {
              bVar17 = false;
            }
            pcVar13 = "cortex-a73";
            goto LAB_00187e46;
          }
          lVar14 = lVar14 + 0x10;
        } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff) << 4 != lVar14);
      }
    }
    if ((*piVar5 == 0x31357830) &&
       ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) != 0)) {
      lVar14 = 0;
      do {
        if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar14 + 8)) &&
           (**(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar14) == 0x7472617020555043)) {
          local_278.Length =
               *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar14 + 8);
          uVar4 = 8;
          if (local_278.Length < 8) {
            uVar4 = local_278.Length;
          }
          local_278.Length = local_278.Length - uVar4;
          local_278.Data =
               (char *)(uVar4 + *(long *)((long)local_240.
                                                super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                                .
                                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                                .super_SmallVectorBase.BeginX + lVar14));
          bVar15 = false;
          Chars_03.Length = 3;
          Chars_03.Data = "\t :";
          sVar2 = StringRef::find_first_not_of(&local_278,Chars_03,0);
          if (local_278.Length <= sVar2) {
            sVar2 = local_278.Length;
          }
          lVar14 = local_278.Length - sVar2;
          if (lVar14 == 5) {
            bVar15 = *(char *)((long)local_278.Data + sVar2 + 4) == 'f' &&
                     *(int *)((long)local_278.Data + sVar2) == 0x36307830;
          }
          if (bVar15) {
            pcVar8 = "krait";
          }
          else {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '1' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30327830;
            }
            else {
              bVar16 = false;
            }
            pcVar8 = "krait";
            if (bVar16) {
              pcVar8 = "kryo";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '5' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30327830;
            }
            else {
              bVar16 = false;
            }
            if (bVar16) {
              pcVar8 = "kryo";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '1' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x31327830;
            }
            else {
              bVar16 = false;
            }
            if (bVar16) {
              pcVar8 = "kryo";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '0' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30387830;
            }
            else {
              bVar16 = false;
            }
            if (bVar16) {
              pcVar8 = "cortex-a73";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '1' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30387830;
            }
            else {
              bVar16 = false;
            }
            if (bVar16) {
              pcVar8 = "cortex-a73";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar16 = *(char *)((long)local_278.Data + sVar2 + 4) == '0' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30637830;
            }
            else {
              bVar16 = false;
            }
            if (bVar16) {
              pcVar8 = "falkor";
            }
            bVar15 = true;
            if (!bVar16) {
              bVar15 = false;
            }
          }
          bVar16 = bVar15;
          if (!bVar15) {
            if (lVar14 == 5) {
              bVar17 = *(char *)((long)local_278.Data + sVar2 + 4) == '1' &&
                       *(int *)((long)local_278.Data + sVar2) == 0x30637830;
            }
            else {
              bVar17 = false;
            }
            pcVar13 = "saphira";
LAB_00187e46:
            if (bVar17) {
              pcVar8 = pcVar13;
            }
            bVar16 = true;
            if (!bVar17) {
              bVar16 = bVar15;
            }
          }
LAB_00187e5a:
          pcVar13 = "generic";
          if (bVar16) {
            pcVar13 = pcVar8;
          }
          if (pcVar13 == (char *)0x0) {
            sVar11 = 0;
          }
          else {
            sVar11 = strlen(pcVar13);
          }
          goto LAB_00187e7d;
        }
        lVar14 = lVar14 + 0x10;
      } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff) << 4 != lVar14);
    }
    if (*piVar5 == 0x33357830) {
      uVar4 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
              0xffffffff;
      uVar9 = 0;
      if (uVar4 != 0) {
        lVar14 = 0;
        uVar10 = 0;
        do {
          local_278.Data = *(char **)((long)pvVar1 + lVar14);
          local_278.Length = ((undefined8 *)((long)pvVar1 + lVar14))[1];
          if (local_278.Length < 0xb) {
            bVar15 = false;
          }
          else {
            bVar15 = *(long *)((long)local_278.Data + 3) == 0x746e616972617620 &&
                     *(long *)local_278.Data == 0x6972617620555043;
          }
          uVar3 = uVar10;
          if (bVar15) {
            if (local_278.Length < 0xb) goto LAB_00187ec3;
            local_278.Data = (char *)((long)local_278.Data + 0xb);
            local_278.Length = local_278.Length - 0xb;
            if (bVar15) {
              Chars_01.Length = 3;
              Chars_01.Data = "\t :";
              sVar2 = StringRef::find_first_not_of(&local_278,Chars_01,0);
              if (local_278.Length <= sVar2) {
                sVar2 = local_278.Length;
              }
              Str.Data = local_278.Length - sVar2;
              Str.Length = 0;
              bVar15 = getAsUnsignedInteger
                                 ((llvm *)(sVar2 + (long)local_278.Data),Str,(uint)&local_260,Result
                                 );
              uVar3 = local_260 & 0xffffffff;
              if (local_260 >> 0x20 != 0) {
                uVar3 = uVar10;
              }
              if (bVar15) {
                uVar3 = uVar10;
              }
            }
          }
          lVar14 = lVar14 + 0x10;
          uVar10 = uVar3;
        } while (uVar4 << 4 != lVar14);
        uVar9 = (int)uVar3 << 0xc;
      }
      pvVar1 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      uVar6 = 0;
      uVar4 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
              0xffffffff;
      if (uVar4 != 0) {
        lVar14 = 0;
        uVar10 = 0;
        do {
          local_278.Data = *(char **)((long)pvVar1 + lVar14);
          local_278.Length = ((undefined8 *)((long)pvVar1 + lVar14))[1];
          if (local_278.Length < 8) {
            bVar15 = false;
          }
          else {
            bVar15 = *(long *)local_278.Data == 0x7472617020555043;
          }
          uVar3 = uVar10;
          if (bVar15) {
            if (local_278.Length < 8) {
LAB_00187ec3:
              __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                            ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
            }
            local_278.Data = (char *)((long)local_278.Data + 8);
            local_278.Length = local_278.Length - 8;
            if (bVar15) {
              Chars_02.Length = 3;
              Chars_02.Data = "\t :";
              sVar2 = StringRef::find_first_not_of(&local_278,Chars_02,0);
              if (local_278.Length <= sVar2) {
                sVar2 = local_278.Length;
              }
              Str_00.Data = local_278.Length - sVar2;
              Str_00.Length = 0;
              bVar15 = getAsUnsignedInteger
                                 ((llvm *)(sVar2 + (long)local_278.Data),Str_00,(uint)&local_260,
                                  Result);
              uVar3 = local_260 & 0xffffffff;
              if (local_260 >> 0x20 != 0) {
                uVar3 = uVar10;
              }
              if (bVar15) {
                uVar3 = uVar10;
              }
            }
          }
          uVar6 = (uint)uVar3;
          lVar14 = lVar14 + 0x10;
          uVar10 = uVar3;
        } while (uVar4 << 4 != lVar14);
      }
      pcVar13 = "exynos-m1";
      if ((uVar6 | uVar9) == 0x4001) {
        pcVar13 = "exynos-m2";
      }
      sVar11 = 9;
    }
  }
LAB_00187e7d:
  if ((undefined1 *)
      local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_230) {
    free(local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  SVar18.Length = sVar11;
  SVar18.Data = pcVar13;
  return SVar18;
}

Assistant:

StringRef sys::detail::getHostCPUNameForARM(StringRef ProcCpuinfoContent) {
  // The cpuid register on arm is not accessible from user space. On Linux,
  // it is exposed through the /proc/cpuinfo file.

  // Read 32 lines from /proc/cpuinfo, which should contain the CPU part line
  // in all cases.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU implementer line.
  StringRef Implementer;
  StringRef Hardware;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("CPU implementer"))
      Implementer = Lines[I].substr(15).ltrim("\t :");
    if (Lines[I].startswith("Hardware"))
      Hardware = Lines[I].substr(8).ltrim("\t :");
  }

  if (Implementer == "0x41") { // ARM Ltd.
    // MSM8992/8994 may give cpu part for the core that the kernel is running on,
    // which is undeterministic and wrong. Always return cortex-a53 for these SoC.
    if (Hardware.endswith("MSM8994") || Hardware.endswith("MSM8996"))
      return "cortex-a53";


    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x926", "arm926ej-s")
            .Case("0xb02", "mpcore")
            .Case("0xb36", "arm1136j-s")
            .Case("0xb56", "arm1156t2-s")
            .Case("0xb76", "arm1176jz-s")
            .Case("0xc08", "cortex-a8")
            .Case("0xc09", "cortex-a9")
            .Case("0xc0f", "cortex-a15")
            .Case("0xc20", "cortex-m0")
            .Case("0xc23", "cortex-m3")
            .Case("0xc24", "cortex-m4")
            .Case("0xd04", "cortex-a35")
            .Case("0xd03", "cortex-a53")
            .Case("0xd07", "cortex-a57")
            .Case("0xd08", "cortex-a72")
            .Case("0xd09", "cortex-a73")
            .Default("generic");
  }

  if (Implementer == "0x51") // Qualcomm Technologies, Inc.
    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x06f", "krait") // APQ8064
            .Case("0x201", "kryo")
            .Case("0x205", "kryo")
            .Case("0x211", "kryo")
            .Case("0x800", "cortex-a73")
            .Case("0x801", "cortex-a73")
            .Case("0xc00", "falkor")
            .Case("0xc01", "saphira")
            .Default("generic");

  if (Implementer == "0x53") { // Samsung Electronics Co., Ltd.
    // The Exynos chips have a convoluted ID scheme that doesn't seem to follow
    // any predictive pattern across variants and parts.
    unsigned Variant = 0, Part = 0;

    // Look for the CPU variant line, whose value is a 1 digit hexadecimal
    // number, corresponding to the Variant bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU variant"))
        I.ltrim("\t :").getAsInteger(0, Variant);

    // Look for the CPU part line, whose value is a 3 digit hexadecimal
    // number, corresponding to the PartNum bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU part"))
        I.ltrim("\t :").getAsInteger(0, Part);

    unsigned Exynos = (Variant << 12) | Part;
    switch (Exynos) {
    default:
      // Default by falling through to Exynos M1.
      LLVM_FALLTHROUGH;

    case 0x1001:
      return "exynos-m1";

    case 0x4001:
      return "exynos-m2";
    }
  }

  return "generic";
}